

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O3

void kernel::TxOutSer<DataStream>(DataStream *ss,COutPoint *outpoint,Coin *coin)

{
  long in_FS_OFFSET;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<DataStream,transaction_identifier<false>,unsigned_int>
            (ss,&outpoint->hash,&outpoint->n);
  local_1c = *(undefined4 *)&coin->field_0x28;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)ss,
             (ss->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_1c);
  SerializeMany<DataStream,long,CScript>(ss,(long *)coin,&(coin->out).scriptPubKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TxOutSer(T& ss, const COutPoint& outpoint, const Coin& coin)
{
    ss << outpoint;
    ss << static_cast<uint32_t>((coin.nHeight << 1) + coin.fCoinBase);
    ss << coin.out;
}